

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pooling.cpp
# Opt level: O0

void CoreMLConverter::convertCaffePooling(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  int iVar2;
  PoolingParameter_PoolMethod PVar3;
  string *psVar4;
  string *psVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  reference __x;
  PoolingLayerParams_ValidCompletePadding *pPVar7;
  NetParameter *in_stack_00000008;
  allocator local_199;
  string local_198;
  uint32 local_174;
  uint32 local_170;
  uint32_t kernel_w;
  uint32_t kernel_h;
  uint32_t stride_w;
  uint32_t stride_h;
  uint32_t pad_w;
  uint32_t pad_h;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  PoolingParameter *local_e8;
  PoolingParameter *caffeLayerParams;
  PoolingLayerParams *specLayerParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *topName;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bottomName;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_51;
  string local_50;
  NeuralNetworkLayer *local_30;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  nnWrite = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)layerParameters._24_8_;
  specLayer = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_30 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                        layerParameters.protoweights);
  iVar2 = caffe::LayerParameter::bottom_size((LayerParameter *)mappingDataBlobNames);
  if ((iVar2 != 1) ||
     (iVar2 = caffe::LayerParameter::top_size((LayerParameter *)mappingDataBlobNames), iVar2 != 1))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Must have 1 input and 1 output",&local_51);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    psVar5 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    errorInCaffeProto(&local_50,psVar4,psVar5);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pRVar6 = caffe::LayerParameter::bottom_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar6);
  bottomName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar6);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1,(iterator *)&bottomName), bVar1) {
    __x = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pRVar6 = caffe::LayerParameter::top_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1_1 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar6);
  topName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar6);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1_1,(iterator *)&topName), bVar1) {
    specLayerParams =
         (PoolingLayerParams *)
         google::protobuf::internal::
         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(value_type *)specLayerParams);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  psVar4 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  convertCaffeMetadata
            (psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)nnWrite);
  caffeLayerParams =
       (PoolingParameter *)CoreML::Specification::NeuralNetworkLayer::mutable_pooling(local_30);
  local_e8 = caffe::LayerParameter::pooling_param((LayerParameter *)mappingDataBlobNames);
  PVar3 = caffe::PoolingParameter::pool(local_e8);
  if (PVar3 == PoolingParameter_PoolMethod_STOCHASTIC) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"pool method",&local_109);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"Pooling",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&pad_h,"Stochastic",(allocator *)((long)&pad_w + 3));
    unsupportedCaffeParrameterWithOption(&local_108,psVar4,&local_130,(string *)&pad_h);
    std::__cxx11::string::~string((string *)&pad_h);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pad_w + 3));
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  PVar3 = caffe::PoolingParameter::pool(local_e8);
  if (PVar3 == PoolingParameter_PoolMethod_MAX) {
    CoreML::Specification::PoolingLayerParams::set_type
              ((PoolingLayerParams *)caffeLayerParams,PoolingLayerParams_PoolingType_MAX);
  }
  else {
    PVar3 = caffe::PoolingParameter::pool(local_e8);
    if (PVar3 == PoolingParameter_PoolMethod_AVE) {
      CoreML::Specification::PoolingLayerParams::set_type
                ((PoolingLayerParams *)caffeLayerParams,PoolingLayerParams_PoolingType_AVERAGE);
    }
  }
  bVar1 = caffe::PoolingParameter::global_pooling(local_e8);
  if (bVar1) {
    CoreML::Specification::PoolingLayerParams::set_globalpooling
              ((PoolingLayerParams *)caffeLayerParams,true);
  }
  stride_h = 0;
  stride_w = 0;
  bVar1 = caffe::PoolingParameter::has_pad(local_e8);
  if (bVar1) {
    stride_h = caffe::PoolingParameter::pad(local_e8);
    stride_w = caffe::PoolingParameter::pad(local_e8);
  }
  else {
    stride_h = caffe::PoolingParameter::pad_h(local_e8);
    stride_w = caffe::PoolingParameter::pad_w(local_e8);
  }
  pPVar7 = CoreML::Specification::PoolingLayerParams::mutable_includelastpixel
                     ((PoolingLayerParams *)caffeLayerParams);
  CoreML::Specification::PoolingLayerParams_ValidCompletePadding::add_paddingamounts
            (pPVar7,(ulong)stride_h);
  pPVar7 = CoreML::Specification::PoolingLayerParams::mutable_includelastpixel
                     ((PoolingLayerParams *)caffeLayerParams);
  CoreML::Specification::PoolingLayerParams_ValidCompletePadding::add_paddingamounts
            (pPVar7,(ulong)stride_w);
  kernel_h = 0;
  kernel_w = 0;
  bVar1 = caffe::PoolingParameter::has_stride(local_e8);
  if (bVar1) {
    kernel_h = caffe::PoolingParameter::stride(local_e8);
    kernel_w = caffe::PoolingParameter::stride(local_e8);
  }
  else {
    kernel_h = caffe::PoolingParameter::stride_h(local_e8);
    kernel_w = caffe::PoolingParameter::stride_w(local_e8);
  }
  if (kernel_w == 0) {
    kernel_w = 1;
  }
  if (kernel_h == 0) {
    kernel_h = 1;
  }
  CoreML::Specification::PoolingLayerParams::add_stride
            ((PoolingLayerParams *)caffeLayerParams,(ulong)kernel_h);
  CoreML::Specification::PoolingLayerParams::add_stride
            ((PoolingLayerParams *)caffeLayerParams,(ulong)kernel_w);
  local_170 = 0;
  local_174 = 0;
  bVar1 = caffe::PoolingParameter::has_kernel_size(local_e8);
  if (bVar1) {
    local_170 = caffe::PoolingParameter::kernel_size(local_e8);
    local_174 = caffe::PoolingParameter::kernel_size(local_e8);
  }
  else {
    local_170 = caffe::PoolingParameter::kernel_h(local_e8);
    local_174 = caffe::PoolingParameter::kernel_w(local_e8);
  }
  if (((local_170 == 0) || (local_174 == 0)) &&
     (bVar1 = caffe::PoolingParameter::global_pooling(local_e8), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"Kernel size must be non-zero",&local_199);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    psVar5 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    errorInCaffeProto(&local_198,psVar4,psVar5);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  CoreML::Specification::PoolingLayerParams::add_kernelsize
            ((PoolingLayerParams *)caffeLayerParams,(ulong)local_170);
  CoreML::Specification::PoolingLayerParams::add_kernelsize
            ((PoolingLayerParams *)caffeLayerParams,(ulong)local_174);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&top.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CoreMLConverter::convertCaffePooling(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    Specification::PoolingLayerParams* specLayerParams = specLayer->mutable_pooling();
    const caffe::PoolingParameter& caffeLayerParams = caffeLayer.pooling_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.pool()==caffe::PoolingParameter::STOCHASTIC){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("pool method",caffeLayer.name(), "Pooling", "Stochastic");
    }
    //***************************************************************
    
    // Copy over the parameters.
    if (caffeLayerParams.pool() == caffe::PoolingParameter::MAX) {
        specLayerParams->set_type(Specification::PoolingLayerParams::MAX);
    } else if (caffeLayerParams.pool() == caffe::PoolingParameter::AVE) {
        specLayerParams->set_type(Specification::PoolingLayerParams::AVERAGE);
    }

    if (caffeLayerParams.global_pooling()) {
        specLayerParams->set_globalpooling(true);
    }

    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.has_pad()){
        pad_h = caffeLayerParams.pad();
        pad_w = caffeLayerParams.pad();
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_h));
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_w));
    
    uint32_t stride_h = 0;
    uint32_t stride_w = 0;
    if (caffeLayerParams.has_stride()){
        stride_h = caffeLayerParams.stride();
        stride_w = caffeLayerParams.stride();
    } else {
        stride_h = caffeLayerParams.stride_h();
        stride_w = caffeLayerParams.stride_w();
    }
    if (stride_w == 0) {
        stride_w = 1;
    }
    if (stride_h == 0){
        stride_h = 1;
    }
    specLayerParams->add_stride(static_cast<uint64_t>(stride_h));
    specLayerParams->add_stride(static_cast<uint64_t>(stride_w));
    
    uint32_t kernel_h = 0;
    uint32_t kernel_w = 0;
    if (caffeLayerParams.has_kernel_size()){
        kernel_h = caffeLayerParams.kernel_size();
        kernel_w = caffeLayerParams.kernel_size();
    } else {
        kernel_h = caffeLayerParams.kernel_h();
        kernel_w = caffeLayerParams.kernel_w();
    }
    if((kernel_h == 0 || (kernel_w == 0)) && !(caffeLayerParams.global_pooling())){
        CoreMLConverter::errorInCaffeProto("Kernel size must be non-zero",caffeLayer.name(),caffeLayer.type());
    }
    
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_h));
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_w));
}